

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O1

bool IsFloat(char *str)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  
  if ((*str == '-') || (*str == '+')) {
    str = str + 1;
  }
  pbVar3 = (byte *)str;
  if (*str != 0x2e) {
    pbVar3 = (byte *)str + -1;
    do {
      pbVar5 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    } while ((byte)(*pbVar5 - 0x30) < 10);
    if (pbVar3 <= str) {
      return false;
    }
  }
  if (*pbVar3 == 0x2e) {
    uVar4 = 0;
    do {
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while ((byte)(pbVar3[lVar1] - 0x30) < 10);
    pbVar3 = pbVar3 + uVar4;
    if (uVar4 < 2) {
      return false;
    }
  }
  if ((*pbVar3 | 0x20) == 0x65) {
    if ((pbVar3[1] == 0x2d) || (pbVar3[1] == 0x2b)) {
      pbVar5 = pbVar3 + 2;
    }
    else {
      pbVar5 = pbVar3 + 1;
    }
    pbVar2 = pbVar5 + -1;
    do {
      pbVar3 = pbVar2 + 1;
      pbVar2 = pbVar2 + 1;
    } while ((byte)(*pbVar3 - 0x30) < 10);
    pbVar3 = (byte *)0x0;
    if (pbVar5 < pbVar2) {
      pbVar3 = pbVar2;
    }
  }
  if (pbVar3 != (byte *)0x0) {
    return *pbVar3 == 0;
  }
  return false;
}

Assistant:

bool IsFloat (const char *str)
{
	const char *pt;
	
	if (*str == '+' || *str == '-')
		str++;

	if (*str == '.')
	{
		pt = str;
	}
	else
	{
		pt = IsNum (str);
		if (pt == NULL)
			return false;
	}
	if (*pt == '.')
	{
		pt = IsNum (pt+1);
		if (pt == NULL)
			return false;
	}
	if (*pt == 'e' || *pt == 'E')
	{
		pt++;
		if (*pt == '+' || *pt == '-')
			pt++;
		pt = IsNum (pt);
	}
	return pt != NULL && *pt == 0;
}